

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O2

void readRFA(string *fileName,adjacencyType *adjVec,startStatesType *startStates,
            finalStatesType *finalStates,int *numOfStates)

{
  bool bVar1;
  ostream *poVar2;
  char delim;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_bool>
  pVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_bool>
  pVar4;
  allocator_type local_37d;
  int numOfStateInDef;
  regex ruleRegex;
  string curString;
  vector<edge,_std::allocator<edge>_> dummy;
  regex isStart;
  string label;
  regex numberInStateDefRegex;
  regex hasLabel;
  regex isFinal;
  smatch res;
  ifstream fileStream;
  
  anon_unknown.dwarf_28c33::openFile((anon_unknown_dwarf_28c33 *)&fileStream,fileName);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&ruleRegex,"[0-9]+",0x10);
  anon_unknown.dwarf_28c33::skipUntilRegex(&curString,&fileStream,&ruleRegex);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&ruleRegex);
  anon_unknown.dwarf_28c33::split
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&ruleRegex,&curString,delim);
  *numOfStates = (int)((ulong)(ruleRegex._8_8_ - ruleRegex._0_8_) >> 5);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&ruleRegex);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&isStart,"([0-9]+)([[])",0x10);
  anon_unknown.dwarf_28c33::skipUntilRegex((string *)&ruleRegex,&fileStream,&isStart);
  std::__cxx11::string::operator=((string *)&curString,(string *)&ruleRegex);
  std::__cxx11::string::~string((string *)&ruleRegex);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&isStart);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&ruleRegex,"(->)",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&isStart,"(color=)",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&isFinal,"(shape=)",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&hasLabel,"(label=\")([^\"]+)",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&numberInStateDefRegex,"([0-9]+)",0x10);
  label._M_dataplus._M_p = (pointer)&label.field_2;
  label._M_string_length = 0;
  res.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  res.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  res.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  res._M_begin._M_current = (char *)0x0;
  label.field_2._M_local_buf[0] = '\0';
  do {
    bVar1 = std::
            regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                      (&curString,&res,&ruleRegex,0);
    if (bVar1) {
      std::vector<edge,_std::allocator<edge>_>::vector(&dummy,0,(allocator_type *)&local_37d);
      anon_unknown.dwarf_28c33::readEdges(&fileStream,adjVec,*numOfStates,&curString,&dummy);
      std::ifstream::close();
      std::vector<edge,_std::allocator<edge>_>::~vector(&dummy);
      std::__cxx11::string::~string((string *)&label);
      std::
      _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)&res);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                (&numberInStateDefRegex);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&hasLabel);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&isFinal);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&isStart);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&ruleRegex);
      std::__cxx11::string::~string((string *)&curString);
      std::ifstream::~ifstream(&fileStream);
      return;
    }
    if (curString._M_string_length != 0) {
      bVar1 = std::
              regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                        (&curString,&res,&numberInStateDefRegex,0);
      if (!bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "Incorrect format of state definition, expected X[label=\"Y\", ...], got "
                                );
        poVar2 = std::operator<<(poVar2,(string *)&curString);
        std::endl<char,std::char_traits<char>>(poVar2);
LAB_00105c0e:
        exit(1);
      }
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str((string_type *)&dummy,&res,1);
      numOfStateInDef = std::__cxx11::stoi((string_type *)&dummy,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&dummy);
      bVar1 = std::
              regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                        (&curString,&res,&hasLabel,0);
      if (!bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cout,"Expected label= in string ");
        poVar2 = std::operator<<(poVar2,(string *)&curString);
        std::endl<char,std::char_traits<char>>(poVar2);
        goto LAB_00105c0e;
      }
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str((string_type *)&dummy,&res,2);
      std::__cxx11::string::operator=((string *)&label,(string *)&dummy);
      std::__cxx11::string::~string((string *)&dummy);
      bVar1 = std::
              regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                        (&curString,&res,&isStart,0);
      if (bVar1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&dummy,1,&label,&local_37d);
        pVar3 = std::
                _Rb_tree<int,std::pair<int_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::_Select1st<std::pair<int_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                ::
                _M_emplace_unique<int&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
                          ((_Rb_tree<int,std::pair<int_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::_Select1st<std::pair<int_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                            *)startStates,&numOfStateInDef,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&dummy);
        if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&pVar3.first._M_node._M_node[1]._M_parent,&label);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&dummy);
      }
      bVar1 = std::
              regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                        (&curString,&res,&isFinal,0);
      if (bVar1) {
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&dummy,1,&numOfStateInDef,
                   (allocator_type *)&local_37d);
        pVar4 = std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>>
                ::_M_emplace_unique<std::__cxx11::string&,std::vector<int,std::allocator<int>>&>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>>
                            *)finalStates,&label,(vector<int,_std::allocator<int>_> *)&dummy);
        if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)(pVar4.first._M_node._M_node + 2),
                     &numOfStateInDef);
        }
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&dummy);
      }
    }
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&fileStream,(string *)&curString);
  } while( true );
}

Assistant:

void readRFA(const string & fileName,
             adjacencyType & adjVec,
             startStatesType & startStates,
             finalStatesType & finalStates,
             int & numOfStates)
{
    ifstream fileStream = openFile(fileName);

    // get number of states
    string curString = skipUntilRegex(fileStream, regex("[0-9]+"));
    numOfStates = static_cast<int>(split(curString, ';').size());

    // parse info about start and final states
    curString = skipUntilRegex(fileStream, regex("([0-9]+)([[])"));

    regex ruleRegex ("(->)");
    regex isStart ("(color=)");
    regex isFinal ("(shape=)");
    regex hasLabel ("(label=\")([^\"]+)");
    regex numberInStateDefRegex ("([0-9]+)");
    smatch res;
    string label;
    int numOfStateInDef;

    while ( ! regex_search(curString, res, ruleRegex)) {
        if ( ! curString.empty()) {
            if (regex_search(curString, res, numberInStateDefRegex)) {
                numOfStateInDef = stoi(res.str(1));
            } else {
                cout << "Incorrect format of state definition, expected X[label=\"Y\", ...], got "
                     << curString << endl;
                exit(1);
            }

            if (regex_search(curString, res, hasLabel)) {
                label = res.str(2);
                // this map state -> nonterminal
                if (regex_search(curString, res, isStart)) {
                    auto states = vector<string>(1, label);
                    auto emplaceResult = startStates.emplace(numOfStateInDef, states);
                    if ( ! emplaceResult.second) {
                        auto iter = emplaceResult.first;
                        (*iter).second.push_back(label);
                    }
                }

                // this map nonterminal -> state
                if (regex_search(curString, res, isFinal)) {
                    auto states = vector<int>(1, numOfStateInDef);
                    auto emplaceResult = finalStates.emplace(label, states);
                    if ( ! emplaceResult.second) {
                        auto iter = emplaceResult.first;
                        (*iter).second.push_back(numOfStateInDef);
                    }
                }
            } else {
                cout << "Expected label= in string " << curString << endl;
                exit(1);
            }
        }
        getline(fileStream, curString);
    }
    vector<edge> dummy = vector<edge>(0);
    readEdges(fileStream, adjVec, static_cast<unsigned int>(numOfStates), curString, dummy);
    fileStream.close();
}